

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<std::vector<bool,_std::allocator<bool>_>_> * __thiscall
tinyusdz::Attribute::get_value<std::vector<bool,std::allocator<bool>>>
          (optional<std::vector<bool,_std::allocator<bool>_>_> *__return_storage_ptr__,
          Attribute *this)

{
  optional<std::vector<bool,_std::allocator<bool>_>_> local_48;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<std::vector<bool,std::allocator<bool>>>(&local_48,&this->_var);
  nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::
  optional<std::vector<bool,_std::allocator<bool>_>,_0>(__return_storage_ptr__,&local_48);
  nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional(&local_48);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }